

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  uint fVerbose;
  char *pcVar3;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      pcVar3 = "Empty network.\n";
    }
    else if (pAVar2->ntkType == ABC_NTK_STRASH) {
      pcVar3 = "Only works for logic networks.\n";
    }
    else {
      if (pAVar2->nObjCounts[8] == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      pAVar2 = Abc_NtkCRetime(pAVar2,fVerbose);
      if (pAVar2 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      pcVar3 = "Sequential cleanup has failed.\n";
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: cretime [-vh]\n");
    Abc_Print(-2,"\t         performs most-forward retiming with equiv classes\n");
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
    pcVar3 = "\t-h     : print the command usage\n";
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandCRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkCRetime( Abc_Ntk_t * pNtk, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fVerbose    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for logic networks.\n" );
        return 1;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkCRetime( pNtk, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential cleanup has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: cretime [-vh]\n" );
    Abc_Print( -2, "\t         performs most-forward retiming with equiv classes\n" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}